

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O1

Fl_Widget * __thiscall Fl_Tabs::value(Fl_Tabs *this)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  long lVar3;
  Fl_Widget *pFVar4;
  Fl_Widget *pFVar5;
  long lVar6;
  
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  iVar1 = (this->super_Fl_Group).children_;
  if (iVar1 == 0) {
    pFVar5 = (Fl_Widget *)0x0;
  }
  else {
    lVar6 = 0;
    pFVar4 = (Fl_Widget *)0x0;
    do {
      pFVar5 = ppFVar2[lVar6];
      lVar3 = 0x30;
      if (pFVar4 == (Fl_Widget *)0x0) {
        if ((pFVar5->flags_ & 2) != 0) {
          lVar3 = 0x28;
          pFVar4 = pFVar5;
          if (iVar1 + -1 == (int)lVar6) goto LAB_001cdfb4;
          pFVar5 = (Fl_Widget *)0x0;
        }
      }
      else {
LAB_001cdfb4:
        (**(code **)((long)pFVar5->_vptr_Fl_Widget + lVar3))();
        pFVar5 = pFVar4;
      }
      lVar6 = lVar6 + 1;
      pFVar4 = pFVar5;
    } while (iVar1 != (int)lVar6);
  }
  return pFVar5;
}

Assistant:

Fl_Widget* Fl_Tabs::value() {
  Fl_Widget* v = 0;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (v) o->hide();
    else if (o->visible()) v = o;
    else if (!i) {o->show(); v = o;}
  }
  return v;
}